

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapRelease(jx9_hashmap *pMap,int FreeDS)

{
  jx9_vm *pVm_00;
  jx9_hashmap_node *pjVar1;
  uint local_34;
  sxu32 n;
  jx9_vm *pVm;
  jx9_hashmap_node *pNext;
  jx9_hashmap_node *pEntry;
  int FreeDS_local;
  jx9_hashmap *pMap_local;
  
  pVm_00 = pMap->pVm;
  local_34 = 0;
  pNext = pMap->pFirst;
  for (; local_34 < pMap->nEntry; local_34 = local_34 + 1) {
    pjVar1 = pNext->pPrev;
    jx9VmUnsetMemObj(pVm_00,pNext->nValIdx);
    if (pNext->iType == 2) {
      SyBlobRelease(&(pNext->xKey).sKey);
    }
    SyMemBackendPoolFree(&pVm_00->sAllocator,pNext);
    pNext = pjVar1;
  }
  if (pMap->nEntry != 0) {
    SyMemBackendFree(&pVm_00->sAllocator,pMap->apBucket);
  }
  if (FreeDS == 0) {
    pMap->apBucket = (jx9_hashmap_node **)0x0;
    pMap->iNextIdx = 0;
    pMap->nSize = 0;
    pMap->nEntry = 0;
    pMap->pCur = (jx9_hashmap_node *)0x0;
    pMap->pLast = (jx9_hashmap_node *)0x0;
    pMap->pFirst = (jx9_hashmap_node *)0x0;
  }
  else {
    SyMemBackendPoolFree(&pVm_00->sAllocator,pMap);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapRelease(jx9_hashmap *pMap, int FreeDS)
{
	jx9_hashmap_node *pEntry, *pNext;
	jx9_vm *pVm = pMap->pVm;
	sxu32 n;
	/* Start the release process */
	n = 0;
	pEntry = pMap->pFirst;
	for(;;){
		if( n >= pMap->nEntry ){
			break;
		}
		pNext = pEntry->pPrev; /* Reverse link */
		/* Restore the jx9_value to the free list */
		jx9VmUnsetMemObj(pVm, pEntry->nValIdx);
		/* Release the node */
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			SyBlobRelease(&pEntry->xKey.sKey);
		}
		SyMemBackendPoolFree(&pVm->sAllocator, pEntry);
		/* Point to the next entry */
		pEntry = pNext;
		n++;
	}
	if( pMap->nEntry > 0 ){
		/* Release the hash bucket */
		SyMemBackendFree(&pVm->sAllocator, pMap->apBucket);
	}
	if( FreeDS ){
		/* Free the whole instance */
		SyMemBackendPoolFree(&pVm->sAllocator, pMap);
	}else{
		/* Keep the instance but reset it's fields */
		pMap->apBucket = 0;
		pMap->iNextIdx = 0;
		pMap->nEntry = pMap->nSize = 0;
		pMap->pFirst = pMap->pLast = pMap->pCur = 0;
	}
	return SXRET_OK;
}